

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void turbounit(void)

{
  packforblockfnc p_Var1;
  unpackforblockfnc p_Var2;
  uint *puVar3;
  runtime_error *this;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  uint uVar11;
  uint8_t *input;
  vector<unsigned_int,_std::allocator<unsigned_int>_> test;
  vector<unsigned_char,_std::allocator<unsigned_char>_> comp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  uint *local_b0;
  uint *local_a8;
  uint local_9c;
  uint *local_98;
  iterator iStack_90;
  uint *local_88;
  uint32_t local_7c;
  ulong local_78;
  uint *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  ulong local_38;
  
  local_98 = (uint *)0x0;
  iStack_90._M_current = (uint *)0x0;
  local_88 = (uint *)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  do {
    if (iStack_90._M_current == local_88) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,iStack_90,
                 (uint *)&local_68);
    }
    else {
      *iStack_90._M_current =
           (uint)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      iStack_90._M_current = iStack_90._M_current + 1;
    }
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         (uint)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
  } while ((uint)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start < 100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,(long)iStack_90._M_current + (0x400 - (long)local_98),
             (allocator_type *)&local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,((long)iStack_90._M_current - (long)local_98 >> 2) + 0x400,
             (allocator_type *)&local_a8);
  uVar8 = (ulong)((long)iStack_90._M_current - (long)local_98) >> 2;
  puVar3 = (uint *)CONCAT44(local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_68.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  local_a8 = local_98;
  uVar6 = (uint)uVar8;
  *puVar3 = uVar6;
  local_b0 = puVar3 + 1;
  if (uVar6 != 0) {
    uVar11 = *local_98;
    uVar5 = uVar11;
    if (uVar6 != 1) {
      uVar9 = 1;
      do {
        uVar4 = local_98[uVar9];
        if (uVar11 < uVar4) {
          uVar11 = uVar4;
        }
        if (uVar4 < uVar5) {
          uVar5 = uVar4;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar8 & 0xffffffff) != uVar9);
    }
    puVar3[1] = uVar5;
    puVar3[2] = uVar11;
    local_b0 = puVar3 + 3;
    uVar4 = 0;
    if (0x1f < uVar6) {
      uVar4 = 0x1f;
      if (uVar11 - uVar5 != 0) {
        for (; uVar11 - uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar9 = 0;
      uVar8 = (ulong)((uVar4 ^ 0xffffffe0) + 0x21);
      if (uVar11 == uVar5) {
        uVar8 = uVar9;
      }
      p_Var1 = funcForPackArr[uVar8];
      do {
        (*p_Var1)(uVar5,&local_a8,(uint8_t **)&local_b0);
        iVar7 = (int)uVar9;
        uVar4 = iVar7 + 0x20;
        uVar9 = (ulong)uVar4;
      } while (iVar7 + 0x40U <= uVar6);
    }
    memcpy(local_b0,local_a8,(ulong)(uVar6 - uVar4) * 4);
    local_b0 = local_b0 + (uVar6 - uVar4);
  }
  puVar3 = (uint *)CONCAT44(local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_68.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  uVar6 = *puVar3;
  uVar8 = (ulong)uVar6;
  if (uVar8 != 0) {
    local_70 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_7c = puVar3[1];
    uVar5 = puVar3[2] - local_7c;
    uVar11 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    local_9c = (uVar11 ^ 0xffffffe0) + 0x21;
    uVar11 = 0;
    if (puVar3[2] == local_7c) {
      local_9c = 0;
    }
    uVar9 = (ulong)(uVar6 >> 5);
    local_78 = uVar9;
    local_38 = uVar8;
    if (0x1f < uVar6) {
      iVar7 = local_9c * 0x20;
      p_Var2 = funcForUnpackArr[local_9c];
      puVar10 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        local_a8 = (uint *)((long)puVar3 + (ulong)(uVar11 >> 3) + 0xc);
        local_b0 = puVar10;
        (*p_Var2)(local_7c,(uint8_t **)&local_a8,&local_b0);
        puVar10 = puVar10 + 0x20;
        uVar11 = uVar11 + iVar7;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    uVar8 = local_38;
    memcpy(local_70 + ((uint)local_38 & 0xffffffe0),
           (void *)((long)puVar3 + (ulong)((int)local_78 * local_9c * 4) + 0xc),
           (ulong)((uint)local_38 * 4 & 0x7c));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_50,uVar8);
  if (((long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start == (long)iStack_90._M_current - (long)local_98) &&
     ((local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start ||
      (iVar7 = bcmp(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,local_98,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start), iVar7 == 0)))) {
    if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT44(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         (uint)local_68.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_68.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)local_68.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
    }
    if (local_98 != (uint *)0x0) {
      operator_delete(local_98);
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"bug");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CPUTimer() : t1(), t2() {
		getrusage(RUSAGE_SELF, &t1);
		// t1 = clock();
		t2 = t1;
	}